

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O2

void __thiscall
VulnerabilityToBin::VulnerabilityToBin
          (VulnerabilityToBin *this,int maxDamageBinIdx,char *binFileName,char *idxFileName,
          bool useIndexFile,bool zip,bool allIntensityBinsCheck)

{
  FILE *pFVar1;
  undefined3 in_register_00000081;
  
  ValidateVulnerability::ValidateVulnerability
            (&this->super_ValidateVulnerability,allIntensityBinsCheck);
  (this->super_ValidateVulnerability)._vptr_ValidateVulnerability =
       (_func_int **)&PTR_WriteBinVulnerabilityFile_00109d10;
  *(int *)&(this->super_ValidateVulnerability).field_0x30b4 = maxDamageBinIdx;
  this->zip_ = zip;
  this->fileOutBin_ = (FILE *)0x0;
  this->fileOutIdx_ = (FILE *)0x0;
  *(undefined8 *)&this->vIdx_ = 0;
  *(undefined8 *)((long)&(this->vIdx_).offset + 4) = 0;
  *(undefined8 *)((long)&(this->vIdx_).size + 4) = 0;
  *(undefined8 *)((long)&(this->vIdx_).original_size + 4) = 0;
  (this->vulnerabilityRows_).super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vulnerabilityRows_).super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vulnerabilityRows_).super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builtin_strncpy((this->super_ValidateVulnerability).super_Validate.fileDescription_,
                  "Vulnerability",0xe);
  (this->super_ValidateVulnerability).convertToBin_ = true;
  (this->super_ValidateVulnerability).useIndexFile_ = useIndexFile;
  if (CONCAT31(in_register_00000081,useIndexFile) == 0) {
    this->fileOutBin_ = _stdout;
  }
  else {
    pFVar1 = fopen(binFileName,"wb");
    this->fileOutBin_ = (FILE *)pFVar1;
    pFVar1 = fopen(idxFileName,"wb");
    this->fileOutIdx_ = (FILE *)pFVar1;
  }
  return;
}

Assistant:

VulnerabilityToBin::VulnerabilityToBin(const int maxDamageBinIdx,
				       const char* binFileName,
				       const char* idxFileName,
				       const bool useIndexFile, const bool zip,
				       const bool allIntensityBinsCheck) :
  ValidateVulnerability(allIntensityBinsCheck),
  maxDamageBinIdx_(maxDamageBinIdx), zip_(zip) {

  strcpy(fileDescription_, "Vulnerability");
  convertToBin_ = true;
  useIndexFile_ = useIndexFile;
  if (useIndexFile_) {
    fileOutBin_ = fopen(binFileName, "wb");
    fileOutIdx_ = fopen(idxFileName, "wb");
  } else {
    fileOutBin_ = stdout;
  }

}